

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sidebar.c
# Opt level: O2

void split_sidebar(wchar_t *invheight,wchar_t *flheight)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  
  wVar3 = inv_icount + L'\x01';
  if (ui_flags.viewheight / 2 <= inv_icount + L'\x01') {
    wVar3 = ui_flags.viewheight / 2;
  }
  *invheight = wVar3;
  wVar1 = floor_icount;
  wVar2 = (ui_flags.viewheight + -1) / 2;
  wVar3 = floor_icount + L'\x01';
  wVar4 = wVar2;
  if (wVar3 < wVar2) {
    wVar4 = wVar3;
  }
  *flheight = wVar4;
  if ((wVar2 <= wVar1) && (*invheight < (ui_flags.viewheight + 1) / 2)) {
    wVar4 = ui_flags.viewheight + ~*invheight;
    if (wVar3 < wVar4) {
      wVar4 = wVar3;
    }
    *flheight = wVar4;
  }
  *invheight = ~wVar4 + ui_flags.viewheight;
  return;
}

Assistant:

static void split_sidebar(int *invheight, int *flheight)
{
    *invheight = min(inv_icount+1, ui_flags.viewheight / 2);
    *flheight = min(floor_icount+1, (ui_flags.viewheight-1) / 2);

    /* if there is need and available space, expand the floor item list up */
    if (floor_icount+1 > *flheight && *invheight < (ui_flags.viewheight+1) / 2)
	*flheight = min(floor_icount+1, ui_flags.viewheight - *invheight - 1);

    /* assign all unused space to the inventory list whether it is needed or not */
    *invheight = ui_flags.viewheight - *flheight - 1;
}